

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_solution.hpp
# Opt level: O2

Spins * __thiscall
openjij::result::get_solution<openjij::graph::Dense<float>>
          (Spins *__return_storage_ptr__,result *this,
          TransverseIsing<openjij::graph::Dense<float>_> *system)

{
  long lVar1;
  float fVar2;
  Index IVar3;
  CoeffReturnType pfVar4;
  size_t i;
  ulong row;
  size_t t;
  long i_00;
  long col;
  float fVar5;
  Spins *ret_spins;
  Lhs local_198;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> local_158;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> local_120;
  Product<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0>,_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
  local_e8;
  Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0>
  local_70;
  
  lVar1 = *(long *)(this + 0x10);
  col = 0;
  fVar2 = INFINITY;
  for (i_00 = 0; lVar1 != i_00; i_00 = i_00 + 1) {
    Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              (&local_158,(Matrix<float,__1,__1,_0,__1,__1> *)this,i_00);
    local_198.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    m_outerStride =
         local_158.
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_outerStride;
    local_198.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    m_startRow.m_value =
         local_158.
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_startRow.m_value;
    local_198.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    m_startCol.m_value =
         local_158.
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_startCol.m_value;
    local_198.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
    _16_8_ = local_158.
             super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
             ._16_8_;
    local_198.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
         local_158.
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_xpr;
    local_198.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
    m_data = local_158.
             super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
             .m_data;
    local_198.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
    m_rows.m_value =
         local_158.
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_rows.m_value;
    Eigen::
    Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0>
    ::Product(&local_70,&local_198,(Rhs *)(this + 0x18));
    Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              (&local_120,(Matrix<float,__1,__1,_0,__1,__1> *)this,i_00);
    Eigen::
    Product<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>
    ::Product(&local_e8,&local_70,&local_120);
    fVar5 = Eigen::internal::dense_product_base::operator_cast_to_float
                      ((dense_product_base *)&local_e8);
    IVar3 = i_00;
    if (fVar2 <= fVar5) {
      IVar3 = col;
      fVar5 = fVar2;
    }
    col = IVar3;
    fVar2 = fVar5;
  }
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,*(size_type *)(this + 0x30),(allocator_type *)&local_e8);
  for (row = 0; row < *(ulong *)(this + 0x30); row = row + 1) {
    pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0> *)this,row,col)
    ;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[row] = (int)*pfVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

const graph::Spins
get_solution(const system::TransverseIsing<GraphType> &system) {
  std::size_t minimum_trotter = 0;
  // aliases
  auto &spins = system.trotter_spins;
  double energy = 0.0;
  double min_energy = std::numeric_limits<double>::max();
  // get number of trotter slices
  std::size_t num_trotter_slices = system.trotter_spins.cols();
  for (std::size_t t = 0; t < num_trotter_slices; t++) {
    // calculate classical energy in each classical spin
    energy = spins.col(t).transpose() * system.interaction * spins.col(t);
    if (energy < min_energy) {
      minimum_trotter = t;
      min_energy = energy;
    }
  }

  // convert from Eigen::Vector to std::vector
  graph::Spins ret_spins(system.num_classical_spins);
  for (std::size_t i = 0; i < system.num_classical_spins; i++) {
    ret_spins[i] = static_cast<graph::Spin>(spins(i, minimum_trotter));
  }
  return ret_spins;
}